

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

void MinMaxType::GetDefault(void)

{
  LogicalType *in_RDI;
  allocator local_31;
  string local_30 [32];
  
  duckdb::LogicalType::LogicalType(in_RDI,INTEGER);
  std::__cxx11::string::string(local_30,"MINMAX",&local_31);
  duckdb::LogicalType::SetAlias();
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static LogicalType GetDefault() {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("MINMAX");
		return type;
	}